

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

char * stumpless_get_param_value(stumpless_param *param)

{
  char *__dest;
  
  if (param == (stumpless_param *)0x0) {
    raise_argument_empty("param was NULL");
    __dest = (char *)0x0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)param->mutex);
    __dest = (char *)alloc_mem(param->value_length + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,param->value,param->value_length);
      __dest[param->value_length] = '\0';
      clear_error();
    }
    pthread_unlock_mutex((pthread_mutex_t *)param->mutex);
  }
  return __dest;
}

Assistant:

const char *
stumpless_get_param_value( const struct stumpless_param *param ) {
  char *value_copy;

  VALIDATE_ARG_NOT_NULL( param );

  lock_param( param );
  value_copy = alloc_mem( param->value_length + 1 );
  if( !value_copy ) {
    goto cleanup_and_return;
  }
  memcpy( value_copy, param->value, param->value_length );
  value_copy[param->value_length] = '\0';
  clear_error(  );

cleanup_and_return:
  unlock_param( param );
  return value_copy;
}